

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O3

boolean breakarm(permonst *ptr)

{
  if (((2 < ptr->msize) ||
      ((ptr->msize == 2 &&
       (ptr == mons + 0x2b || (ptr == mons + 0x133 || (ptr->mflags1 & 0x20000) == 0))))) &&
     (ptr != mons + 0x9f && ptr->mlet != '\x16')) {
    return ptr->mlet != '6';
  }
  return '\0';
}

Assistant:

boolean breakarm(const struct permonst *ptr)
{
	return ((bigmonst(ptr) || (ptr->msize > MZ_SMALL && !humanoid(ptr)) ||
		/* special cases of humanoids that cannot wear body armor */
		ptr == &mons[PM_MARILITH] || ptr == &mons[PM_WINGED_GARGOYLE])
	      && !sliparm(ptr));
}